

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

vector<Color,_std::allocator<Color>_> * __thiscall
Face::update_layer(vector<Color,_std::allocator<Color>_> *__return_storage_ptr__,Face *this,
                  Corner corner,int layer,vector<Color,_std::allocator<Color>_> *new_layer)

{
  value_type vVar1;
  pointer ppVar2;
  reference pvVar3;
  mapped_type *ppCVar4;
  _Rb_tree_iterator<std::pair<const_Position,_Color_*>_> local_48;
  Corner local_3c;
  undefined1 local_38 [4];
  int entry;
  Position to_access;
  vector<Color,_std::allocator<Color>_> *new_layer_local;
  int layer_local;
  Corner corner_local;
  Face *this_local;
  vector<Color,_std::allocator<Color>_> *old_layer;
  
  to_access.layer._3_1_ = 0;
  unique0x100000c5 = new_layer;
  std::vector<Color,_std::allocator<Color>_>::vector(__return_storage_ptr__);
  local_38 = (undefined1  [4])corner;
  entry = layer;
  for (local_3c = U; (int)local_3c < layer * 2 + 1; local_3c = local_3c + L) {
    to_access.reference_corner = local_3c;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Position,_Color_*,_std::less<Position>,_std::allocator<std::pair<const_Position,_Color_*>_>_>
         ::find(&this->current_state,(key_type *)local_38);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Position,_Color_*>_>::operator->(&local_48);
    std::vector<Color,_std::allocator<Color>_>::push_back(__return_storage_ptr__,ppVar2->second);
    pvVar3 = std::vector<Color,_std::allocator<Color>_>::operator[](new_layer,(long)(int)local_3c);
    vVar1 = *pvVar3;
    ppCVar4 = std::
              map<Position,_Color_*,_std::less<Position>,_std::allocator<std::pair<const_Position,_Color_*>_>_>
              ::operator[](&this->current_state,(key_type *)local_38);
    **ppCVar4 = vVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Color> Face::update_layer(Corner corner, int layer, std::vector<Color> new_layer){
    std::vector<Color> old_layer;
    Position to_access;
    to_access.layer =  layer;
    to_access.reference_corner = corner;
    for(int entry = 0; entry < 2*layer + 1; entry++){
        to_access.entry = entry;
        old_layer.push_back(*current_state.find(to_access)->second);
        *(current_state[to_access]) = new_layer[entry];
    }
    return old_layer;
}